

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

void jsoncons::detail::fill_exponent<jsoncons::string_sink<std::__cxx11::string>>
               (int K,string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *result)

{
  char cVar1;
  
  cVar1 = (char)result->buf_ptr;
  if (K < 0) {
    std::__cxx11::string::push_back(cVar1);
    K = -K;
  }
  else {
    std::__cxx11::string::push_back(cVar1);
  }
  if ((uint)K < 10) {
    std::__cxx11::string::push_back((char)result->buf_ptr);
    cVar1 = (char)result->buf_ptr;
  }
  else {
    if ((uint)K < 100) {
      std::__cxx11::string::push_back((char)result->buf_ptr);
    }
    else {
      if (999 < (uint)K) {
        from_integer<int,jsoncons::string_sink<std::__cxx11::string>>(K,result);
        return;
      }
      std::__cxx11::string::push_back((char)result->buf_ptr);
      std::__cxx11::string::push_back((char)result->buf_ptr);
    }
    cVar1 = (char)result->buf_ptr;
  }
  std::__cxx11::string::push_back(cVar1);
  return;
}

Assistant:

void fill_exponent(int K, Result& result)
    {
        if (K < 0)
        {
            result.push_back('-');
            K = -K;
        }
        else
        {
            result.push_back('+'); // compatibility with sprintf
        }

        if (K < 10)
        {
            result.push_back('0'); // compatibility with sprintf
            result.push_back((char)('0' + K));
        }
        else if (K < 100)
        {
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else if (K < 1000)
        {
            result.push_back((char)('0' + K / 100)); K %= 100;
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else
        {
            jsoncons::detail::from_integer(K, result);
        }
    }